

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_78::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this)

{
  pointer pLVar1;
  pointer pLVar2;
  long lVar3;
  Enum EVar4;
  int *unaff_R12;
  ulong uVar5;
  
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pLVar2 - (long)pLVar1;
  if (lVar3 == 0) {
    PrintError(this,"accessing stack depth: %u >= max: %zd",0,0);
  }
  else {
    unaff_R12 = (int *)((long)pLVar1 + lVar3 + -0x18);
  }
  EVar4 = Error;
  if (pLVar2 != pLVar1) {
    if (*unaff_R12 == 5) {
      pLVar1 = (this->label_stack_).
               super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = (long)(this->label_stack_).
                    super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1;
      uVar5 = (lVar3 >> 3) * -0x5555555555555555;
      if (uVar5 < 2) {
        PrintError(this,"accessing stack depth: %u >= max: %zd",1,uVar5);
      }
      else {
        *unaff_R12 = 6;
        lVar3 = *(long *)((long)pLVar1 + lVar3 + -0x28);
        if (*(long *)(lVar3 + 0x10) == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                        ,0x192,
                        "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                       );
        }
        lVar3 = *(long *)(lVar3 + 8);
        if (*(int *)(lVar3 + 0x38) != 0x38) {
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                        ,0x4e,
                        "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]");
        }
        *(long *)(unaff_R12 + 2) = lVar3 + 0x118;
        EVar4 = Ok;
      }
    }
    else {
      PrintError(this,"catch expression without matching try");
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr() {
  LabelNode* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->label_type != LabelType::Try) {
    PrintError("catch expression without matching try");
    return Result::Error;
  }

  LabelNode* parent_label;
  CHECK_RESULT(GetLabelAt(&parent_label, 1));

  label->label_type = LabelType::Catch;
  label->exprs = &cast<TryExpr>(&parent_label->exprs->back())->catch_;
  return Result::Ok;
}